

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<unsigned_int,4ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>_>_>
          *result)

{
  bool bVar1;
  allocator local_e9;
  string local_e8;
  optional<std::array<unsigned_int,_4UL>_> local_c8;
  undefined1 local_b4 [8];
  array<unsigned_int,_4UL> value_1;
  char local_89;
  undefined1 local_88 [7];
  char c;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  array<unsigned_int,_4UL> value;
  vector<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>_>_>
  *result_local;
  char sep_local;
  AsciiParser *this_local;
  
  ::std::
  vector<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>_>_>
  ::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = MaybeNone(this);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::optional
                ((optional<std::array<unsigned_int,_4UL>_> *)(value._M_elems + 3));
      ::std::
      vector<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>_>_>
      ::push_back(result,(value_type *)(value._M_elems + 3));
      nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::~optional
                ((optional<std::array<unsigned_int,_4UL>_> *)(value._M_elems + 3));
    }
    else {
      bVar1 = ParseBasicTypeTuple<unsigned_int,4ul>(this,(array<unsigned_int,_4UL> *)local_50);
      if (!bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_70,"Not starting with the tuple value of requested type.\n",
                   &local_71);
        PushError(this,&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
        return false;
      }
      nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::
      optional<std::array<unsigned_int,_4UL>_&,_0>
                ((optional<std::array<unsigned_int,_4UL>_> *)local_88,
                 (array<unsigned_int,_4UL> *)local_50);
      ::std::
      vector<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>_>_>
      ::push_back(result,(value_type *)local_88);
      nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::~optional
                ((optional<std::array<unsigned_int,_4UL>_> *)local_88);
    }
    while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = Char1(this,&local_89);
      if (!bVar1) {
        return false;
      }
      if (local_89 != sep) {
        StreamReader::seek_from_current(this->_sr,-1);
        break;
      }
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = MaybeNone(this);
      if (bVar1) {
        nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::optional
                  ((optional<std::array<unsigned_int,_4UL>_> *)(value_1._M_elems + 3));
        ::std::
        vector<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>_>_>
        ::push_back(result,(value_type *)(value_1._M_elems + 3));
        nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::~optional
                  ((optional<std::array<unsigned_int,_4UL>_> *)(value_1._M_elems + 3));
      }
      else {
        bVar1 = ParseBasicTypeTuple<unsigned_int,4ul>(this,(array<unsigned_int,_4UL> *)local_b4);
        if (!bVar1) break;
        nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::
        optional<std::array<unsigned_int,_4UL>_&,_0>(&local_c8,(array<unsigned_int,_4UL> *)local_b4)
        ;
        ::std::
        vector<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>_>_>
        ::push_back(result,&local_c8);
        nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::~optional(&local_c8);
      }
    }
    bVar1 = ::std::
            vector<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>_>_>
            ::empty(result);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_e8,"Empty array.\n",&local_e9);
      PushError(this,&local_e8);
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}